

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_nls.c
# Opt level: O3

int cvNlsConvTest(SUNNonlinearSolver NLS,N_Vector ycor,N_Vector delta,sunrealtype tol,N_Vector ewt,
                 void *cvode_mem)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int m;
  int local_3c;
  sunrealtype local_38;
  double local_30;
  
  if (cvode_mem == (void *)0x0) {
    cvProcessError((CVodeMem)0x0,-0x15,0x140,"cvNlsConvTest",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvode/cvode_nls.c"
                   ,"cvode_mem = NULL illegal.");
    return -0x15;
  }
  local_38 = tol;
  local_30 = (double)N_VWrmsNorm(delta,ewt);
  iVar1 = SUNNonlinSolGetCurIter(NLS,&local_3c);
  if (iVar1 != 0) {
    return -0x15;
  }
  dVar4 = *(double *)((long)cvode_mem + 0x2a0);
  if (local_3c < 1) {
    dVar3 = 1.0;
    if (dVar4 <= 1.0) {
      dVar3 = dVar4;
    }
    if (1.0 < (local_30 * dVar3) / local_38) goto LAB_0011716b;
    if (local_3c == 0) goto LAB_0011718d;
  }
  else {
    dVar3 = *(double *)((long)cvode_mem + 0x2a8);
    dVar2 = dVar4 * 0.3;
    if (dVar4 * 0.3 <= local_30 / dVar3) {
      dVar2 = local_30 / dVar3;
    }
    *(double *)((long)cvode_mem + 0x2a0) = dVar2;
    dVar4 = 1.0;
    if (dVar2 <= 1.0) {
      dVar4 = dVar2;
    }
    if (1.0 < (dVar4 * local_30) / local_38) {
      if (dVar3 + dVar3 < local_30) {
        return 0x386;
      }
LAB_0011716b:
      *(double *)((long)cvode_mem + 0x2a8) = local_30;
      return 0x385;
    }
  }
  local_30 = (double)N_VWrmsNorm(ycor,ewt);
LAB_0011718d:
  *(double *)((long)cvode_mem + 0x2b0) = local_30;
  *(undefined4 *)((long)cvode_mem + 0x2b8) = 1;
  return 0;
}

Assistant:

static int cvNlsConvTest(SUNNonlinearSolver NLS, N_Vector ycor, N_Vector delta,
                         sunrealtype tol, N_Vector ewt, void* cvode_mem)
{
  CVodeMem cv_mem;
  int m, retval;
  sunrealtype del;
  sunrealtype dcon;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  /* compute the norm of the correction */
  del = N_VWrmsNorm(delta, ewt);

  /* get the current nonlinear solver iteration count */
  retval = SUNNonlinSolGetCurIter(NLS, &m);
  if (retval != CV_SUCCESS) { return (CV_MEM_NULL); }

  /* Test for convergence. If m > 0, an estimate of the convergence
     rate constant is stored in crate, and used in the test.        */
  if (m > 0)
  {
    cv_mem->cv_crate = SUNMAX(CRDOWN * cv_mem->cv_crate, del / cv_mem->cv_delp);
  }
  dcon = del * SUNMIN(ONE, cv_mem->cv_crate) / tol;

  if (dcon <= ONE)
  {
    cv_mem->cv_acnrm    = (m == 0) ? del : N_VWrmsNorm(ycor, ewt);
    cv_mem->cv_acnrmcur = SUNTRUE;
    return (CV_SUCCESS); /* Nonlinear system was solved successfully */
  }

  /* check if the iteration seems to be diverging */
  if ((m >= 1) && (del > RDIV * cv_mem->cv_delp))
  {
    return (SUN_NLS_CONV_RECVR);
  }

  /* Save norm of correction and loop again */
  cv_mem->cv_delp = del;

  /* Not yet converged */
  return (SUN_NLS_CONTINUE);
}